

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.cc
# Opt level: O2

void __thiscall bidirectional::Search::makeHeap(Search *this)

{
  vector<labelling::Label,_std::allocator<labelling::Label>_> *pvVar1;
  
  pvVar1 = (this->unprocessed_labels)._M_t.
           super___uniq_ptr_impl<std::vector<labelling::Label,_std::allocator<labelling::Label>_>,_std::default_delete<std::vector<labelling::Label,_std::allocator<labelling::Label>_>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_std::vector<labelling::Label,_std::allocator<labelling::Label>_>_*,_std::default_delete<std::vector<labelling::Label,_std::allocator<labelling::Label>_>_>_>
           .
           super__Head_base<0UL,_std::vector<labelling::Label,_std::allocator<labelling::Label>_>_*,_false>
           ._M_head_impl;
  if (this->direction == FWD) {
    std::
    make_heap<__gnu_cxx::__normal_iterator<labelling::Label*,std::vector<labelling::Label,std::allocator<labelling::Label>>>,std::greater<void>>
              ();
    return;
  }
  std::
  make_heap<__gnu_cxx::__normal_iterator<labelling::Label*,std::vector<labelling::Label,std::allocator<labelling::Label>>>>
            (*(Label **)
              &(pvVar1->super__Vector_base<labelling::Label,_std::allocator<labelling::Label>_>).
               _M_impl,
             *(pointer *)
              ((long)&(pvVar1->
                      super__Vector_base<labelling::Label,_std::allocator<labelling::Label>_>).
                      _M_impl + 8));
  return;
}

Assistant:

void Search::makeHeap() {
  if (direction == FWD) {
    // Min-heap
    std::make_heap(
        unprocessed_labels->begin(),
        unprocessed_labels->end(),
        std::greater<>{});
  } else {
    // Max-heap
    std::make_heap(unprocessed_labels->begin(), unprocessed_labels->end());
  }
}